

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckColor(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  TidyAllocator *pTVar2;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var3;
  Bool BVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ctmbstr color;
  tmbstr ptVar8;
  uint uVar9;
  ulong uVar10;
  char *str;
  _colors *p_Var11;
  long lVar12;
  
  if ((attval == (AttVal *)0x0) || (color = attval->value, color == (ctmbstr)0x0)) {
    uVar5 = 0x256;
    goto LAB_0013c62b;
  }
  if (*color == '#') {
LAB_0013c607:
    BVar4 = IsValidColorCode(color + 1);
    if (BVar4 == no) {
LAB_0013c73f:
      BVar4 = prvTidyIsHTML5Mode(doc);
      iVar6 = prvTidytmbstrcasecmp(color,"black");
      if (iVar6 != 0) {
        p_Var11 = colors;
        lVar7 = 0;
        do {
          lVar12 = lVar7 + 0x10;
          if (lVar12 == 0x100) {
            if (BVar4 == no) goto LAB_0013c7ea;
            iVar6 = prvTidytmbstrcasecmp(color,"aliceblue");
            if (iVar6 == 0) {
              p_Var11 = extended_colors;
              goto LAB_0013c796;
            }
            uVar9 = 1;
            p_Var11 = extended_colors;
            goto LAB_0013c7ca;
          }
          iVar6 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[1].name + lVar7));
          lVar7 = lVar12;
        } while (iVar6 != 0);
        goto LAB_0013c78a;
      }
      p_Var11 = colors;
      goto LAB_0013c796;
    }
  }
  else {
    BVar4 = IsValidColorCode(color);
    if (BVar4 == no) {
      if (*color == '#') goto LAB_0013c607;
      goto LAB_0013c73f;
    }
    pTVar2 = doc->allocator;
    p_Var3 = pTVar2->vtbl->alloc;
    uVar5 = prvTidytmbstrlen(color);
    ptVar8 = (tmbstr)(*p_Var3)(pTVar2,(long)uVar5 + 2);
    *ptVar8 = '#';
    lVar7 = 1;
    do {
      cVar1 = color[lVar7 + -1];
      ptVar8[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (cVar1 != '\0');
    prvTidyReportAttrError(doc,node,attval,0x22a);
    (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
    attval->value = ptVar8;
    color = ptVar8;
  }
  if (*color == '#') {
    if (*(int *)((doc->config).value + 0x48) != 0) {
      BVar4 = prvTidyIsHTML5Mode(doc);
      iVar6 = prvTidytmbstrcasecmp(color,"#000000");
      if (iVar6 == 0) {
        str = "black";
      }
      else {
        lVar7 = 0;
        do {
          lVar12 = lVar7;
          if (lVar12 + 0x10 == 0x100) {
            if (BVar4 == no) goto LAB_0013c830;
            iVar6 = prvTidytmbstrcasecmp(color,"#f0f8ff");
            if (iVar6 == 0) {
              str = "aliceblue";
              goto LAB_0013c805;
            }
            uVar10 = 1;
            goto LAB_0013c87c;
          }
          iVar6 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[1].hex + lVar12));
          lVar7 = lVar12 + 0x10;
        } while (iVar6 != 0);
        str = *(char **)((long)&colors[1].name + lVar12);
        if (str == (ctmbstr)0x0) goto LAB_0013c830;
      }
LAB_0013c805:
      (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
      color = prvTidytmbstrdup(doc->allocator,str);
      attval->value = color;
    }
    goto LAB_0013c830;
  }
  ptVar8 = attval->value;
  goto LAB_0013c841;
  while( true ) {
    iVar6 = prvTidytmbstrcasecmp(color,extended_colors[uVar10].hex);
    uVar10 = (ulong)((int)uVar10 + 1);
    if (iVar6 == 0) break;
LAB_0013c87c:
    str = extended_colors[uVar10].name;
    if (str == (ctmbstr)0x0) goto LAB_0013c830;
  }
  goto LAB_0013c805;
  while( true ) {
    iVar6 = prvTidytmbstrcasecmp(color,extended_colors[uVar9].name);
    uVar9 = uVar9 + 1;
    if (iVar6 == 0) break;
LAB_0013c7ca:
    lVar12 = (ulong)uVar9 * 0x10;
    if (extended_colors[uVar9].name == (ctmbstr)0x0) goto LAB_0013c7ea;
  }
LAB_0013c78a:
  p_Var11 = (_colors *)((long)&p_Var11->name + lVar12);
LAB_0013c796:
  if (p_Var11->hex == (ctmbstr)0x0) {
LAB_0013c7ea:
    uVar5 = 0x22b;
LAB_0013c62b:
    prvTidyReportAttrError(doc,node,attval,uVar5);
    return;
  }
LAB_0013c830:
  ptVar8 = attval->value;
  if (*color == '#') {
    ptVar8 = prvTidytmbstrtoupper(ptVar8);
    goto LAB_0013c846;
  }
LAB_0013c841:
  ptVar8 = prvTidytmbstrtolower(ptVar8);
LAB_0013c846:
  attval->value = ptVar8;
  return;
}

Assistant:

void CheckColor( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Bool valid = no;
    tmbstr given;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    given = attval->value;

    /* 727851 - add hash to hash-less color values */
    if (given[0] != '#' && (valid = IsValidColorCode(given)))
    {
        tmbstr cp, s;

        cp = s = (tmbstr) TidyDocAlloc(doc, 2 + TY_(tmbstrlen)(given));
        *cp++ = '#';
        while ('\0' != (*cp++ = *given++))
            continue;

        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE_REPLACED);

        TidyDocFree(doc, attval->value);
        given = attval->value = s;
    }

    if (!valid && given[0] == '#')
        valid = IsValidColorCode(given + 1);

    if (valid && given[0] == '#' && cfgBool(doc, TidyReplaceColor))
    {
        ctmbstr newName = GetColorName(given, TY_(IsHTML5Mode)(doc));

        if (newName)
        {
            TidyDocFree(doc, attval->value);
            given = attval->value = TY_(tmbstrdup)(doc->allocator, newName);
        }
    }

    /* if it is not a valid color code, it is a color name */
    if (!valid)
        valid = GetColorCode(given, TY_(IsHTML5Mode)(doc)) != NULL;

    if (valid && given[0] == '#')
        attval->value = TY_(tmbstrtoupper)(attval->value);
    else if (valid)
        attval->value = TY_(tmbstrtolower)(attval->value);

    if (!valid)
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}